

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_traits.h
# Opt level: O0

void __thiscall
google::protobuf::json_internal::ParseProto3Type::SetString
          (ParseProto3Type *this,Field f,Msg *msg,string_view x)

{
  int32_t iVar1;
  Field *this_00;
  size_type sVar2;
  const_pointer buffer;
  Msg *msg_local;
  Field f_local;
  string_view x_local;
  
  x_local._M_len = x._M_len;
  f_local = (Field)msg;
  RecordAsSeen((Field)this,(Msg *)f);
  this_00 = ResolverPool::Field::proto((Field *)this);
  iVar1 = Field::number(this_00);
  io::CodedOutputStream::WriteTag((CodedOutputStream *)f,iVar1 << 3 | 2);
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&f_local);
  io::CodedOutputStream::WriteVarint64((CodedOutputStream *)f,sVar2);
  buffer = std::basic_string_view<char,_std::char_traits<char>_>::data
                     ((basic_string_view<char,_std::char_traits<char>_> *)&f_local);
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&f_local);
  io::CodedOutputStream::WriteRaw((CodedOutputStream *)f,buffer,(int)sVar2);
  return;
}

Assistant:

static void SetString(Field f, Msg& msg, absl::string_view x) {
    RecordAsSeen(f, msg);
    msg.stream_.WriteTag(f->proto().number() << 3 |
                         WireFormatLite::WIRETYPE_LENGTH_DELIMITED);
    msg.stream_.WriteVarint64(static_cast<uint64_t>(x.size()));
    msg.stream_.WriteRaw(x.data(), x.size());
  }